

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3DropTrigger(Parse *pParse,SrcList *pName,int noErr)

{
  sqlite3 *db_00;
  char *zRight;
  char *pKey;
  int iVar1;
  uint local_50;
  int j;
  sqlite3 *db;
  char *zName;
  char *zDb;
  Trigger *pTStack_28;
  int i;
  Trigger *pTrigger;
  int noErr_local;
  SrcList *pName_local;
  Parse *pParse_local;
  
  pTStack_28 = (Trigger *)0x0;
  db_00 = pParse->db;
  if ((db_00->mallocFailed == '\0') && (iVar1 = sqlite3ReadSchema(pParse), iVar1 == 0)) {
    zRight = pName->a[0].zDatabase;
    pKey = pName->a[0].zName;
    for (zDb._4_4_ = 0; (int)zDb._4_4_ < db_00->nDb; zDb._4_4_ = zDb._4_4_ + 1) {
      if ((int)zDb._4_4_ < 2) {
        local_50 = zDb._4_4_ ^ 1;
      }
      else {
        local_50 = zDb._4_4_;
      }
      if (((zRight == (char *)0x0) ||
          (iVar1 = sqlite3StrICmp(db_00->aDb[(int)local_50].zDbSName,zRight), iVar1 == 0)) &&
         (pTStack_28 = (Trigger *)
                       sqlite3HashFind(&(db_00->aDb[(int)local_50].pSchema)->trigHash,pKey),
         pTStack_28 != (Trigger *)0x0)) break;
    }
    if (pTStack_28 == (Trigger *)0x0) {
      if (noErr == 0) {
        sqlite3ErrorMsg(pParse,"no such trigger: %S",pName,0);
      }
      else {
        sqlite3CodeVerifyNamedSchema(pParse,zRight);
      }
      pParse->checkSchema = '\x01';
    }
    else {
      sqlite3DropTriggerPtr(pParse,pTStack_28);
    }
  }
  sqlite3SrcListDelete(db_00,pName);
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3DropTrigger(Parse *pParse, SrcList *pName, int noErr){
  Trigger *pTrigger = 0;
  int i;
  const char *zDb;
  const char *zName;
  sqlite3 *db = pParse->db;

  if( db->mallocFailed ) goto drop_trigger_cleanup;
  if( SQLITE_OK!=sqlite3ReadSchema(pParse) ){
    goto drop_trigger_cleanup;
  }

  assert( pName->nSrc==1 );
  zDb = pName->a[0].zDatabase;
  zName = pName->a[0].zName;
  assert( zDb!=0 || sqlite3BtreeHoldsAllMutexes(db) );
  for(i=OMIT_TEMPDB; i<db->nDb; i++){
    int j = (i<2) ? i^1 : i;  /* Search TEMP before MAIN */
    if( zDb && sqlite3StrICmp(db->aDb[j].zDbSName, zDb) ) continue;
    assert( sqlite3SchemaMutexHeld(db, j, 0) );
    pTrigger = sqlite3HashFind(&(db->aDb[j].pSchema->trigHash), zName);
    if( pTrigger ) break;
  }
  if( !pTrigger ){
    if( !noErr ){
      sqlite3ErrorMsg(pParse, "no such trigger: %S", pName, 0);
    }else{
      sqlite3CodeVerifyNamedSchema(pParse, zDb);
    }
    pParse->checkSchema = 1;
    goto drop_trigger_cleanup;
  }
  sqlite3DropTriggerPtr(pParse, pTrigger);

drop_trigger_cleanup:
  sqlite3SrcListDelete(db, pName);
}